

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Expression *expression;
  BinaryenIndex index_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::ArrayNewFixed>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<ArrayNewFixed>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x10d3,
                  "BinaryenExpressionRef BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (expr + 1));
  if (index < sVar2) {
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (expr + 1),(ulong)index);
    return *ppEVar3;
  }
  __assert_fail("index < static_cast<ArrayNewFixed*>(expression)->values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x10d4,
                "BinaryenExpressionRef BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef, BinaryenIndex)"
               );
}

Assistant:

BinaryenExpressionRef
BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef expr,
                                BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayNewFixed>());
  assert(index < static_cast<ArrayNewFixed*>(expression)->values.size());
  return static_cast<ArrayNewFixed*>(expression)->values[index];
}